

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall common_log_entry::print(common_log_entry *this,FILE *file)

{
  long lVar1;
  ggml_log_level gVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *__format;
  
  gVar2 = this->level;
  if (file == (FILE *)0x0) {
    if ((gVar2 == GGML_LOG_LEVEL_DEBUG) && (common_log_verbosity_thold < 1)) {
      return;
    }
    if (gVar2 == GGML_LOG_LEVEL_NONE) {
      puVar3 = (undefined8 *)&stdout;
    }
    else {
      puVar3 = (undefined8 *)&stderr;
    }
    file = (FILE *)*puVar3;
  }
  if (((gVar2 == GGML_LOG_LEVEL_NONE) || (gVar2 == GGML_LOG_LEVEL_CONT)) || (this->prefix != true))
  goto switchD_0020d371_default;
  lVar1 = this->timestamp;
  if (lVar1 != 0) {
    fprintf((FILE *)file,"%s%d.%02d.%03d.%03d%s ",
            g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start[5],lVar1 / 60000000 & 0xffffffff,
            (lVar1 / 1000000) % 0x3c & 0xffffffff,(lVar1 / 1000) % 1000 & 0xffffffff,lVar1 % 1000,
            *g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start);
    gVar2 = this->level;
  }
  switch(gVar2) {
  case GGML_LOG_LEVEL_DEBUG:
    pcVar5 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[4];
    __format = "%sD %s";
    break;
  case GGML_LOG_LEVEL_INFO:
    pcVar4 = *g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar5 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[3];
    __format = "%sI %s";
    goto LAB_0020d3cb;
  case GGML_LOG_LEVEL_WARN:
    pcVar5 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[6];
    __format = "%sW %s";
    break;
  case GGML_LOG_LEVEL_ERROR:
    pcVar5 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    __format = "%sE %s";
    break;
  default:
    goto switchD_0020d371_default;
  }
  pcVar4 = "";
LAB_0020d3cb:
  fprintf((FILE *)file,__format,pcVar5,pcVar4);
switchD_0020d371_default:
  fputs((this->msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start,(FILE *)file);
  if ((this->level < GGML_LOG_LEVEL_CONT) && ((0x1aU >> (this->level & 0x1f) & 1) != 0)) {
    fputs(*g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start,(FILE *)file);
  }
  fflush((FILE *)file);
  return;
}

Assistant:

void print(FILE * file = nullptr) const {
        FILE * fcur = file;
        if (!fcur) {
            // stderr displays DBG messages only when their verbosity level is not higher than the threshold
            // these messages will still be logged to a file
            if (level == GGML_LOG_LEVEL_DEBUG && common_log_verbosity_thold < LOG_DEFAULT_DEBUG) {
                return;
            }

            fcur = stdout;

            if (level != GGML_LOG_LEVEL_NONE) {
                fcur = stderr;
            }
        }

        if (level != GGML_LOG_LEVEL_NONE && level != GGML_LOG_LEVEL_CONT && prefix) {
            if (timestamp) {
                // [M.s.ms.us]
                fprintf(fcur, "%s%d.%02d.%03d.%03d%s ",
                        g_col[COMMON_LOG_COL_BLUE],
                        (int) (timestamp / 1000000 / 60),
                        (int) (timestamp / 1000000 % 60),
                        (int) (timestamp / 1000 % 1000),
                        (int) (timestamp % 1000),
                        g_col[COMMON_LOG_COL_DEFAULT]);
            }

            switch (level) {
                case GGML_LOG_LEVEL_INFO:  fprintf(fcur, "%sI %s", g_col[COMMON_LOG_COL_GREEN],   g_col[COMMON_LOG_COL_DEFAULT]); break;
                case GGML_LOG_LEVEL_WARN:  fprintf(fcur, "%sW %s", g_col[COMMON_LOG_COL_MAGENTA], ""                        ); break;
                case GGML_LOG_LEVEL_ERROR: fprintf(fcur, "%sE %s", g_col[COMMON_LOG_COL_RED],     ""                        ); break;
                case GGML_LOG_LEVEL_DEBUG: fprintf(fcur, "%sD %s", g_col[COMMON_LOG_COL_YELLOW],  ""                        ); break;
                default:
                    break;
            }
        }

        fprintf(fcur, "%s", msg.data());

        if (level == GGML_LOG_LEVEL_WARN || level == GGML_LOG_LEVEL_ERROR || level == GGML_LOG_LEVEL_DEBUG) {
            fprintf(fcur, "%s", g_col[COMMON_LOG_COL_DEFAULT]);
        }

        fflush(fcur);
    }